

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::StateType::StateType(StateType *this,StateType *from)

{
  bool bVar1;
  ValueType *this_00;
  StateType *from_local;
  StateType *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__StateType_006f02c8;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_wrappedtype(from);
  if (bVar1) {
    this_00 = (ValueType *)operator_new(0x20);
    ValueType::ValueType(this_00,from->wrappedtype_);
    this->wrappedtype_ = this_00;
  }
  else {
    this->wrappedtype_ = (ValueType *)0x0;
  }
  return;
}

Assistant:

StateType::StateType(const StateType& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_wrappedtype()) {
    wrappedtype_ = new ::CoreML::Specification::MILSpec::ValueType(*from.wrappedtype_);
  } else {
    wrappedtype_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.StateType)
}